

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireHandWithOneCardAddCardTest_tryAddCardOnFoundationPileWithFail_Test::TestBody
          (SolitaireHandWithOneCardAddCardTest_tryAddCardOnFoundationPileWithFail_Test *this)

{
  FunctionMocker<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  *this_00;
  FoundationPileMock *pFVar1;
  Solitaire *this_01;
  pointer *__ptr;
  char *message;
  optional<solitaire::cards::Card> cardToAdd;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_98;
  MatcherBase<std::optional<solitaire::cards::Card>_&> local_78;
  char local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_50;
  PileId local_34;
  _Storage<solitaire::cards::Card,_true> local_30;
  undefined1 local_28;
  
  local_30 = *(_Storage<solitaire::cards::Card,_true> *)((anonymous_namespace)::oneCard._8_8_ + -8);
  local_28 = 1;
  pFVar1 = (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
           super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock;
  this_00 = &pFVar1->gmock00_createSnapshot_12;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,pFVar1);
  local_98.function_mocker_ =
       (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)this_00;
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
  ::InternalExpectedAt
            ((MockSpec<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_()>
              *)&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1d5,"lastFoundationPileMock","createSnapshot()");
  pFVar1 = (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
           super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock;
  testing::Matcher<std::optional<solitaire::cards::Card>_&>::Matcher
            ((Matcher<std::optional<solitaire::cards::Card>_&> *)&local_78,
             (optional<solitaire::cards::Card> *)&local_30._M_value);
  piles::FoundationPileMock::gmock_tryAddCard
            (&local_98,pFVar1,(Matcher<std::optional<solitaire::cards::Card>_&> *)&local_78);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::InternalExpectedAt
            (&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1d6,"lastFoundationPileMock","tryAddCard(cardToAdd)");
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&local_98.matchers_);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase(&local_78);
  this_01 = &(this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
             super_SolitaireEmptyHandTest.super_SolitaireTest.solitaire;
  local_34.t = (anonymous_namespace)::lastFoundationPileId;
  Solitaire::tryAddCardOnFoundationPile(this_01,&local_34);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_98,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::oneCard);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_50,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_98);
  if (local_98.function_mocker_ !=
      (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)0x0) {
    operator_delete(local_98.function_mocker_,
                    (long)local_98.matchers_.
                          super__Tuple_impl<0UL,_testing::Matcher<std::optional<solitaire::cards::Card>_&>_>
                          .
                          super__Head_base<0UL,_testing::Matcher<std::optional<solitaire::cards::Card>_&>,_false>
                          ._M_head_impl.super_MatcherBase<std::optional<solitaire::cards::Card>_&>.
                          vtable_ - (long)local_98.function_mocker_);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_98,
             &local_50);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_78,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_98);
  if (local_98.function_mocker_ !=
      (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)0x0) {
    operator_delete(local_98.function_mocker_,
                    (long)local_98.matchers_.
                          super__Tuple_impl<0UL,_testing::Matcher<std::optional<solitaire::cards::Card>_&>_>
                          .
                          super__Head_base<0UL,_testing::Matcher<std::optional<solitaire::cards::Card>_&>,_false>
                          ._M_head_impl.super_MatcherBase<std::optional<solitaire::cards::Card>_&>.
                          vtable_ - (long)local_98.function_mocker_);
  }
  Solitaire::getCardsInHand(this_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_60,(char *)&local_78,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  if (local_78.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface != (_func_int **)0x0)
  {
    operator_delete(local_78.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface,
                    (long)local_78.buffer_.ptr -
                    (long)local_78.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  if (local_50.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x1d9,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_98.function_mocker_ !=
        (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)0x0) {
      (*((local_98.function_mocker_)->super_UntypedFunctionMockerBase).
        _vptr_UntypedFunctionMockerBase[1])();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardAddCardTest, tryAddCardOnFoundationPileWithFail) {
    std::optional<Card> cardToAdd {oneCard.back()};

    EXPECT_CALL(lastFoundationPileMock, createSnapshot());
    EXPECT_CALL(lastFoundationPileMock, tryAddCard(cardToAdd));

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(oneCard));
}